

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_navigationarrow.cpp
# Opt level: O0

void QtMWidgets::NavigationArrow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  Direction *pDVar2;
  Direction DVar3;
  QColor *pQVar4;
  void *_v_1;
  NavigationArrow *_t_2;
  void *_v;
  NavigationArrow *_t_1;
  int *result;
  NavigationArrow *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 0) {
      clicked((NavigationArrow *)_o);
    }
    else if (_id == 1) {
      animate((NavigationArrow *)_o);
    }
    else if (_id == 2) {
      _q_timer((NavigationArrow *)_o);
    }
  }
  else if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    if (pcVar1 == clicked && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  else if (_c == ReadProperty) {
    pDVar2 = (Direction *)*_a;
    if (_id == 0) {
      DVar3 = direction((NavigationArrow *)_o);
      *pDVar2 = DVar3;
    }
    else if (_id == 1) {
      pQVar4 = color((NavigationArrow *)_o);
      *(undefined8 *)pDVar2 = *(undefined8 *)pQVar4;
      pDVar2[2] = *(Direction *)((long)&pQVar4->ct + 4);
      *(ushort *)(pDVar2 + 3) = (pQVar4->ct).argb.pad;
    }
  }
  else if (_c == WriteProperty) {
    if (_id == 0) {
      setDirection((NavigationArrow *)_o,((QColor *)*_a)->cspec);
    }
    else if (_id == 1) {
      setColor((NavigationArrow *)_o,(QColor *)*_a);
    }
  }
  return;
}

Assistant:

void QtMWidgets::NavigationArrow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<NavigationArrow *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->clicked(); break;
        case 1: _t->animate(); break;
        case 2: _t->_q_timer(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (NavigationArrow::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&NavigationArrow::clicked)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<NavigationArrow *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< Direction*>(_v) = _t->direction(); break;
        case 1: *reinterpret_cast< QColor*>(_v) = _t->color(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<NavigationArrow *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDirection(*reinterpret_cast< Direction*>(_v)); break;
        case 1: _t->setColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_a;
}